

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O3

void __thiscall
dap::Chan<std::function<void_()>_>::put(Chan<std::function<void_()>_> *this,function<void_()> *in)

{
  bool bVar1;
  _Map_pointer ppfVar2;
  _Map_pointer ppfVar3;
  _Elt_pointer pfVar4;
  _Elt_pointer pfVar5;
  _Elt_pointer pfVar6;
  _Elt_pointer pfVar7;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  ppfVar2 = (this->queue).c.
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  ppfVar3 = (this->queue).c.
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pfVar4 = (this->queue).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pfVar5 = (this->queue).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  pfVar6 = (this->queue).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  pfVar7 = (this->queue).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  bVar1 = this->closed;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue,in);
  if ((((long)pfVar6 - (long)pfVar7 >> 5) +
       ((long)pfVar4 - (long)pfVar5 >> 5) +
       ((((ulong)((long)ppfVar2 - (long)ppfVar3) >> 3) - 1) + (ulong)(ppfVar2 == (_Map_pointer)0x0))
       * 0x10 == 0) && ((bVar1 & 1U) == 0)) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void Chan<T>::put(T&& in) {
  std::unique_lock<std::mutex> lock(mutex);
  auto notify = queue.size() == 0 && !closed;
  queue.push(std::move(in));
  if (notify) {
    cv.notify_all();
  }
}